

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_extension.cc
# Opt level: O1

int __thiscall
google::protobuf::compiler::java::ImmutableExtensionGenerator::GenerateRegistrationCode
          (ImmutableExtensionGenerator *this,Printer *printer)

{
  FieldDescriptor *in_RDX;
  string local_38;
  
  UnderscoresToCamelCase_abi_cxx11_(&local_38,(java *)this->descriptor_,in_RDX);
  io::Printer::Print(printer,"registry.add($scope$.$name$);\n","scope",&this->scope_,"name",
                     &local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return 7;
}

Assistant:

int ImmutableExtensionGenerator::GenerateRegistrationCode(
    io::Printer* printer) {
  printer->Print(
    "registry.add($scope$.$name$);\n",
    "scope", scope_,
    "name", UnderscoresToCamelCase(descriptor_));
  return 7;
}